

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImRect *pIVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar5 = GImGui;
  GImGui->NavLayer = layer;
  window = pIVar5->NavWindow;
  if (layer == ImGuiNavLayer_Main) {
    window = ImGui::NavRestoreLastChildNavWindow(window);
    pIVar5->NavWindow = window;
  }
  pIVar5 = GImGui;
  IVar2 = window->NavLastIds[layer];
  if (IVar2 != 0) {
    GImGui->NavId = IVar2;
    pIVar3 = pIVar5->NavWindow;
    pIVar3->NavLastIds[(int)layer] = IVar2;
    IVar4 = window->NavRectRel[layer].Max;
    pIVar1 = pIVar3->NavRectRel + (int)layer;
    pIVar1->Min = window->NavRectRel[layer].Min;
    pIVar1->Max = IVar4;
    pIVar5->NavMousePosDirty = true;
    pIVar5->NavDisableHighlight = false;
    pIVar5->NavDisableMouseHover = true;
    return;
  }
  ImGui::NavInitWindow(window,true);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    if (g.NavWindow->NavLastIds[layer] != 0)
        ImGui::SetNavIDWithRectRel(g.NavWindow->NavLastIds[layer], layer, g.NavWindow->NavRectRel[layer]);
    else
        ImGui::NavInitWindow(g.NavWindow, true);
}